

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Matrix<float,_3,_4>_>::operator()
          (InputLess<tcu::Matrix<float,_3,_4>_> *this,Matrix<float,_3,_4> *mat1,
          Matrix<float,_3,_4> *mat2)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  InputLess<tcu::Vector<float,_3>_> local_32;
  InputLess<tcu::Vector<float,_3>_> local_31;
  
  bVar1 = InputLess<tcu::Vector<float,_3>_>::operator()
                    (&local_32,(Vector<float,_3> *)mat1,(Vector<float,_3> *)mat2);
  bVar3 = true;
  if (!bVar1) {
    uVar2 = 0;
    do {
      bVar1 = InputLess<tcu::Vector<float,_3>_>::operator()
                        (&local_31,(Vector<float,_3> *)mat2,(Vector<float,_3> *)mat1);
      if (bVar1) {
        bVar1 = false;
        goto LAB_0073f5d3;
      }
      bVar3 = uVar2 < 3;
      if (uVar2 == 3) goto LAB_0073f5d3;
      mat1 = (Matrix<float,_3,_4> *)((long)mat1 + 0xc);
      mat2 = (Matrix<float,_3,_4> *)((long)mat2 + 0xc);
      bVar1 = InputLess<tcu::Vector<float,_3>_>::operator()
                        (&local_32,(Vector<float,_3> *)mat1,(Vector<float,_3> *)mat2);
      uVar2 = uVar2 + 1;
    } while (!bVar1);
    bVar1 = true;
LAB_0073f5d3:
    bVar3 = (bool)(bVar3 & bVar1);
  }
  return bVar3;
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}